

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.h
# Opt level: O2

int getNumWidth(size_t n)

{
  int iVar1;
  
  iVar1 = 1;
  for (; 9 < n; n = n / 10) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

inline int getNumWidth(size_t n)
{
  int w = 1;
  while (n >= 10) {
    n /= 10;
    ++w;
  }
  return w;
}